

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofRAngle.hpp
# Opt level: O0

void __thiscall
OpenMD::GofRTheta::GofRTheta
          (GofRTheta *this,SimInfo *info,string *filename,string *sele1,string *sele2,string *sele3,
          RealType len,int nrbins,int nangleBins)

{
  string *in_RCX;
  SimInfo *in_RDX;
  GofRAngle *in_RSI;
  undefined8 *in_RDI;
  string *in_R8;
  string *in_R9;
  string *in_XMM0_Qa;
  int unaff_retaddr;
  int in_stack_00000008;
  undefined4 in_stack_00000010;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff64;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  string local_78 [32];
  string local_58 [24];
  RealType in_stack_ffffffffffffffc0;
  
  GofRAngle::GofRAngle
            (in_RSI,in_RDX,in_RCX,in_R8,in_R9,in_XMM0_Qa,in_stack_ffffffffffffffc0,unaff_retaddr,
             in_stack_00000008);
  *in_RDI = &PTR__GofRTheta_0055ebb0;
  getPrefix(in_stack_ffffffffffffff68);
  std::operator+(in_stack_ffffffffffffff68,
                 (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_00000010));
  StaticAnalyser::setOutputName
            ((StaticAnalyser *)CONCAT44(in_stack_ffffffffffffff64,in_stack_00000010),
             (string *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_00000008));
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_78);
  return;
}

Assistant:

GofRTheta(SimInfo* info, const std::string& filename,
              const std::string& sele1, const std::string& sele2,
              const std::string& sele3, RealType len, int nrbins,
              int nangleBins) :
        GofRAngle(info, filename, sele1, sele2, sele3, len, nrbins,
                  nangleBins) {
      setOutputName(getPrefix(filename) + ".gofrt");
    }